

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DExporter::AttrHelper_Col4DArrToString
          (X3DExporter *this,aiColor4D *pArray,size_t pArray_Size,string *pTargetString)

{
  undefined8 *puVar1;
  size_type sVar2;
  pointer pcVar3;
  string *psVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  long *plVar8;
  size_type sVar9;
  string *__range2;
  ulong uVar10;
  undefined8 uVar11;
  float *pfVar12;
  ulong *local_1a0;
  long local_198;
  ulong local_190;
  long lStack_188;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  string *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  size_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTargetString->_M_string_length = 0;
  *(pTargetString->_M_dataplus)._M_p = '\0';
  local_120 = pTargetString;
  std::__cxx11::string::reserve((ulong)pTargetString);
  if (pArray_Size != 0) {
    pfVar12 = &pArray->a;
    do {
      local_58 = pArray_Size;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_50,vsnprintf,0x3a,"%f",SUB84((double)((aiColor4D *)(pfVar12 + -3))->r,0));
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_1a0 = &local_190;
      puVar7 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar7) {
        local_190 = *puVar7;
        lStack_188 = plVar5[3];
      }
      else {
        local_190 = *puVar7;
        local_1a0 = (ulong *)*plVar5;
      }
      local_198 = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_d8,vsnprintf,0x3a,"%f",SUB84((double)pfVar12[-2],0));
      uVar10 = 0xf;
      if (local_1a0 != &local_190) {
        uVar10 = local_190;
      }
      if (uVar10 < local_d8._M_string_length + local_198) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar11 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_d8._M_string_length + local_198) goto LAB_00351c3e;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_1a0);
      }
      else {
LAB_00351c3e:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1a0,(ulong)local_d8._M_dataplus._M_p);
      }
      local_180 = &local_170;
      puVar1 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar1) {
        local_170 = *puVar1;
        uStack_168 = puVar6[3];
      }
      else {
        local_170 = *puVar1;
        local_180 = (undefined8 *)*puVar6;
      }
      local_178 = puVar6[1];
      *puVar6 = puVar1;
      puVar6[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
      puVar7 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar7) {
        local_a8 = *puVar7;
        lStack_a0 = plVar5[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *puVar7;
        local_b8 = (ulong *)*plVar5;
      }
      local_b0 = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_f8,vsnprintf,0x3a,"%f",SUB84((double)pfVar12[-1],0));
      uVar10 = 0xf;
      if (local_b8 != &local_a8) {
        uVar10 = local_a8;
      }
      if (uVar10 < local_f8._M_string_length + local_b0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          uVar11 = local_f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_f8._M_string_length + local_b0) goto LAB_00351d85;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_00351d85:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_f8._M_dataplus._M_p)
        ;
      }
      local_160 = &local_150;
      puVar1 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar1) {
        local_150 = *puVar1;
        uStack_148 = puVar6[3];
      }
      else {
        local_150 = *puVar1;
        local_160 = (undefined8 *)*puVar6;
      }
      local_158 = puVar6[1];
      *puVar6 = puVar1;
      puVar6[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
      puVar7 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar7) {
        local_88 = *puVar7;
        lStack_80 = plVar5[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *puVar7;
        local_98 = (ulong *)*plVar5;
      }
      local_90 = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_118,vsnprintf,0x3a,"%f",SUB84((double)*pfVar12,0));
      uVar10 = 0xf;
      if (local_98 != &local_88) {
        uVar10 = local_88;
      }
      if (uVar10 < local_118._M_string_length + local_90) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          uVar11 = local_118.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_118._M_string_length + local_90) goto LAB_00351ecc;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_98);
      }
      else {
LAB_00351ecc:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_98,(ulong)local_118._M_dataplus._M_p);
      }
      local_140 = &local_130;
      puVar1 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar1) {
        local_130 = *puVar1;
        uStack_128 = puVar6[3];
      }
      else {
        local_130 = *puVar1;
        local_140 = (undefined8 *)*puVar6;
      }
      local_138 = puVar6[1];
      *puVar6 = puVar1;
      puVar6[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
      local_78 = &local_68;
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_68 = *plVar8;
        lStack_60 = plVar5[3];
      }
      else {
        local_68 = *plVar8;
        local_78 = (long *)*plVar5;
      }
      local_70 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_120,(ulong)local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98);
      }
      if (local_160 != &local_150) {
        operator_delete(local_160);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pfVar12 = pfVar12 + 4;
      pArray_Size = local_58 - 1;
    } while (pArray_Size != 0);
  }
  psVar4 = local_120;
  std::__cxx11::string::resize((ulong)local_120,(char)local_120->_M_string_length + -1);
  sVar2 = psVar4->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (psVar4->_M_dataplus)._M_p;
    sVar9 = 0;
    do {
      if (pcVar3[sVar9] == ',') {
        pcVar3[sVar9] = '.';
      }
      sVar9 = sVar9 + 1;
    } while (sVar2 != sVar9);
  }
  return;
}

Assistant:

void X3DExporter::AttrHelper_Col4DArrToString(const aiColor4D* pArray, const size_t pArray_Size, string& pTargetString)
{
	pTargetString.clear();
	pTargetString.reserve(pArray_Size * 8);// (Number + space) * 4.
	for(size_t idx = 0; idx < pArray_Size; idx++)
		pTargetString.append(to_string(pArray[idx].r) + " " + to_string(pArray[idx].g) + " " + to_string(pArray[idx].b) + " " +
								to_string(pArray[idx].a) + " ");

	// remove last space symbol.
	pTargetString.resize(pTargetString.length() - 1);
	AttrHelper_CommaToPoint(pTargetString);
}